

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::OpenPopupEx(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  int *piVar1;
  ImVec2 *mouse_pos;
  uint remaining;
  int iVar2;
  uint uVar3;
  int iVar4;
  ImVec2 IVar5;
  ImGuiPopupData *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiPopupData *__dest;
  int iVar9;
  long lVar10;
  ImGuiContext *g;
  int iVar11;
  int iVar12;
  ImVec2 *pIVar13;
  ImVec2 local_40;
  ImGuiWindow *local_38;
  
  pIVar7 = GImGui;
  remaining = (GImGui->BeginPopupStack).Size;
  if (((popup_flags & 0x20U) == 0) || ((GImGui->OpenPopupStack).Size <= (int)remaining)) {
    local_40.x = 0.0;
    local_40.y = 0.0;
    lVar10 = (long)(GImGui->CurrentWindow->IDStack).Size;
    if (lVar10 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                    ,0x70b,"T &ImVector<unsigned int>::back() [T = unsigned int]");
    }
    local_38 = GImGui->NavWindow;
    iVar2 = GImGui->FrameCount;
    uVar3 = (GImGui->CurrentWindow->IDStack).Data[lVar10 + -1];
    local_40 = NavCalcPreferredRefPos();
    mouse_pos = &(pIVar7->IO).MousePos;
    bVar8 = IsMousePosValid(mouse_pos);
    pIVar13 = &local_40;
    if (bVar8) {
      pIVar13 = mouse_pos;
    }
    IVar5 = *pIVar13;
    iVar11 = (pIVar7->OpenPopupStack).Size;
    if ((int)remaining < iVar11) {
      if ((int)remaining < 0) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                      ,0x702,"T &ImVector<ImGuiPopupData>::operator[](int) [T = ImGuiPopupData]");
      }
      pIVar6 = (pIVar7->OpenPopupStack).Data;
      if ((pIVar6[remaining].PopupId == id) &&
         (pIVar6[remaining].OpenFrameCount == pIVar7->FrameCount + -1)) {
        pIVar6[remaining].OpenFrameCount = iVar2;
        return;
      }
      ClosePopupToLevel(remaining,false);
      iVar11 = (pIVar7->OpenPopupStack).Size;
    }
    iVar4 = (pIVar7->OpenPopupStack).Capacity;
    if (iVar11 == iVar4) {
      if (iVar4 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar4 / 2 + iVar4;
      }
      iVar12 = iVar11 + 1;
      if (iVar11 + 1 < iVar9) {
        iVar12 = iVar9;
      }
      if (iVar4 < iVar12) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiPopupData *)
                 (*GImAllocatorAllocFunc)((long)iVar12 * 0x30,GImAllocatorUserData);
        pIVar6 = (pIVar7->OpenPopupStack).Data;
        if (pIVar6 != (ImGuiPopupData *)0x0) {
          memcpy(__dest,pIVar6,(long)(pIVar7->OpenPopupStack).Size * 0x30);
          pIVar6 = (pIVar7->OpenPopupStack).Data;
          if ((pIVar6 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
        }
        (pIVar7->OpenPopupStack).Data = __dest;
        (pIVar7->OpenPopupStack).Capacity = iVar12;
      }
    }
    pIVar6 = (pIVar7->OpenPopupStack).Data;
    iVar11 = (pIVar7->OpenPopupStack).Size;
    pIVar6[iVar11].PopupId = id;
    *(undefined4 *)&pIVar6[iVar11].field_0x4 = 0;
    pIVar6[iVar11].Window = (ImGuiWindow *)0x0;
    pIVar6[iVar11].SourceWindow = local_38;
    pIVar6[iVar11].OpenFrameCount = iVar2;
    pIVar6[iVar11].OpenParentId = uVar3;
    pIVar6[iVar11].OpenPopupPos = local_40;
    pIVar6[iVar11].OpenMousePos = IVar5;
    (pIVar7->OpenPopupStack).Size = (pIVar7->OpenPopupStack).Size + 1;
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    const int current_stack_size = g.BeginPopupStack.Size;

    if (popup_flags & ImGuiPopupFlags_NoOpenOverExistingPopup)
        if (IsPopupOpen(0u, ImGuiPopupFlags_AnyPopupId))
            return;

    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    IMGUI_DEBUG_LOG_POPUP("OpenPopupEx(0x%08X)\n", id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            ClosePopupToLevel(current_stack_size, false);
            g.OpenPopupStack.push_back(popup_ref);
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}